

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

void writesf_open(t_writesf *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_float tVar2;
  int local_64;
  undefined1 local_60 [8];
  t_soundfiler_writeargs wa;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *s_local;
  t_writesf *x_local;
  
  wa._48_8_ = argv;
  argv_local._4_4_ = argc;
  ptStack_18 = s;
  s_local = (t_symbol *)x;
  memset(local_60,0,0x38);
  if (*(int *)&s_local[0x19].s_thing != 0) {
    writesf_stop((t_writesf *)s_local);
  }
  iVar1 = soundfiler_parsewriteargs
                    (s_local,(int *)((long)&argv_local + 4),(t_atom **)&wa.wa_normalize,
                     (t_soundfiler_writeargs *)local_60);
  if ((iVar1 == 0) && (wa.wa_onsetframes._4_4_ == 0)) {
    if ((((int)wa.wa_onsetframes != 0) || (wa.wa_nframes != 0)) || (wa._24_8_ != -1)) {
      pd_error(s_local,"writesf~ open: normalize/onset/nframes argument ignored");
    }
    if (argv_local._4_4_ != 0) {
      pd_error(s_local,"writesf~ open: extra argument(s) ignored");
    }
    pthread_mutex_lock((pthread_mutex_t *)(s_local + 0x1f));
    while (*(int *)&s_local[0x19].s_next != 0) {
      pthread_cond_signal((pthread_cond_t *)&s_local[0x20].s_next);
      pthread_cond_wait((pthread_cond_t *)&s_local[0x22].s_next,(pthread_mutex_t *)(s_local + 0x1f))
      ;
    }
    s_local[0x1a].s_name = *(char **)local_60;
    s_local[0x1b].s_name = (char *)wa.wa_filesym;
    if ((int)wa.wa_type < 1) {
      if (*(float *)((long)&s_local[0x19].s_thing + 4) <= 0.0) {
        tVar2 = sys_getsr();
        *(int *)&s_local[0x1b].s_thing = (int)tVar2;
      }
      else {
        *(int *)&s_local[0x1b].s_thing = (int)*(float *)((long)&s_local[0x19].s_thing + 4);
      }
    }
    else {
      *(int *)&s_local[0x1b].s_thing = (int)wa.wa_type;
    }
    if (wa.wa_type._4_4_ < 3) {
      local_64 = 2;
    }
    else {
      local_64 = wa.wa_type._4_4_;
    }
    *(int *)&s_local[0x1b].s_next = local_64;
    *(int *)&s_local[0x1c].s_thing = wa.wa_samplerate;
    *(int *)((long)&s_local[0x1c].s_thing + 4) =
         *(int *)((long)&s_local[0x1b].s_thing + 4) * *(int *)&s_local[0x1b].s_next;
    s_local[0x1e].s_thing = (_class **)0x0;
    *(undefined4 *)&s_local[0x19].s_next = 1;
    *(undefined4 *)&s_local[0x1d].s_next = 0;
    *(undefined4 *)((long)&s_local[0x1d].s_thing + 4) = 0;
    *(undefined4 *)((long)&s_local[0x1d].s_next + 4) = 0;
    *(undefined4 *)&s_local[0x1a].s_thing = 0;
    *(undefined4 *)&s_local[0x19].s_thing = 1;
    *(int *)&s_local[0x1d].s_thing =
         *(int *)&s_local[3].s_name -
         *(int *)&s_local[3].s_name % (*(int *)((long)&s_local[0x1c].s_thing + 4) << 7);
    iVar1 = *(int *)&s_local[0x1d].s_thing /
            (*(int *)((long)&s_local[0x1c].s_thing + 4) * *(int *)&s_local[0x18].s_next * 0x10);
    *(int *)((long)&s_local[0x1e].s_name + 4) = iVar1;
    *(int *)&s_local[0x1e].s_name = iVar1;
    pthread_cond_signal((pthread_cond_t *)&s_local[0x20].s_next);
    pthread_mutex_unlock((pthread_mutex_t *)(s_local + 0x1f));
  }
  else {
    pd_error(s_local,"usage: open [flags] filename...");
    post("flags: -bytes <n> %s -big -little -rate <n>",sf_typeargs);
  }
  return;
}

Assistant:

static void writesf_open(t_writesf *x, t_symbol *s, int argc, t_atom *argv)
{
    t_soundfiler_writeargs wa = {0};
    if (x->x_state != STATE_IDLE)
        writesf_stop(x);
    if (soundfiler_parsewriteargs(x, &argc, &argv, &wa) || wa.wa_ascii)
    {
        pd_error(x, "usage: open [flags] filename...");
        post("flags: -bytes <n> %s -big -little -rate <n>", sf_typeargs);
        return;
    }
    if (wa.wa_normalize || wa.wa_onsetframes || (wa.wa_nframes != SFMAXFRAMES))
        pd_error(x, "writesf~ open: normalize/onset/nframes argument ignored");
    if (argc)
        pd_error(x, "writesf~ open: extra argument(s) ignored");
    pthread_mutex_lock(&x->x_mutex);
        /* make sure that the child thread has finished writing */
    while (x->x_requestcode != REQUEST_NOTHING)
    {
        sfread_cond_signal(&x->x_requestcondition);
        sfread_cond_wait(&x->x_answercondition, &x->x_mutex);
    }
    x->x_filename = wa.wa_filesym->s_name;
    x->x_sf.sf_type = wa.wa_type;
    if (wa.wa_samplerate > 0)
        x->x_sf.sf_samplerate = wa.wa_samplerate;
    else if (x->x_insamplerate > 0)
        x->x_sf.sf_samplerate = x->x_insamplerate;
    else x->x_sf.sf_samplerate = sys_getsr();
    x->x_sf.sf_bytespersample =
        (wa.wa_bytespersample > 2 ? wa.wa_bytespersample : 2);
    x->x_sf.sf_bigendian = wa.wa_bigendian;
    x->x_sf.sf_bytesperframe = x->x_sf.sf_nchannels * x->x_sf.sf_bytespersample;
    x->x_frameswritten = 0;
    x->x_requestcode = REQUEST_OPEN;
    x->x_fifotail = 0;
    x->x_fifohead = 0;
    x->x_eof = 0;
    x->x_fileerror = 0;
    x->x_state = STATE_STARTUP;
        /* set fifosize from bufsize.  fifosize must be a
        multiple of the number of bytes eaten for each DSP
        tick.  */
    x->x_fifosize = x->x_bufsize - (x->x_bufsize %
        (x->x_sf.sf_bytesperframe * MAXVECSIZE));
        /* arrange for the "request" condition to be signaled 16
            times per buffer */
    x->x_sigcountdown = x->x_sigperiod = (x->x_fifosize /
            (16 * (x->x_sf.sf_bytesperframe * x->x_vecsize)));
    sfread_cond_signal(&x->x_requestcondition);
    pthread_mutex_unlock(&x->x_mutex);
}